

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontenginemultifontconfig.cpp
# Opt level: O0

FcPattern * __thiscall
QFontEngineMultiFontConfig::getMatchPatternForFallback
          (QFontEngineMultiFontConfig *this,int fallBackIndex)

{
  int iVar1;
  parameter_type t;
  qsizetype qVar2;
  const_reference pp_Var3;
  undefined8 uVar4;
  QList<_FcPattern_*> *in_RDI;
  long in_FS_OFFSET;
  FcPattern *requestPattern;
  FcPattern *ret;
  FcResult result;
  QByteArray cs;
  FcValue value;
  QString *in_stack_ffffffffffffff48;
  QList<_FcPattern_*> *in_stack_ffffffffffffff50;
  QFontEngineMulti *in_stack_ffffffffffffff58;
  _FcPattern *local_68;
  undefined4 local_5c;
  ulong local_58;
  char *local_50;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  ulong local_18;
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QFontEngineMulti::fallbackFamilyCount((QFontEngineMulti *)0xa7f6f4);
  t = (parameter_type)(long)iVar1;
  qVar2 = QList<_FcPattern_*>::size((QList<_FcPattern_*> *)&in_RDI[0xc].d.size);
  if (qVar2 < (long)t) {
    in_stack_ffffffffffffff58 = (QFontEngineMulti *)&in_RDI[0xc].d.size;
    QFontEngineMulti::fallbackFamilyCount((QFontEngineMulti *)0xa7f731);
    QList<_FcPattern_*>::resize(in_RDI,(qsizetype)in_stack_ffffffffffffff58);
  }
  pp_Var3 = QList<_FcPattern_*>::at(in_stack_ffffffffffffff50,(qsizetype)in_stack_ffffffffffffff48);
  local_68 = *pp_Var3;
  if (local_68 == (_FcPattern *)0x0) {
    uVar4 = FcPatternCreate();
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = 0xaaaaaaaa00000003;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QFontEngineMulti::fallbackFamilyAt
              (in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    QString::toUtf8(in_stack_ffffffffffffff48);
    QString::~QString((QString *)0xa7f802);
    local_50 = QByteArray::data((QByteArray *)in_stack_ffffffffffffff50);
    local_58 = local_18;
    local_10 = local_50;
    FcPatternAdd(uVar4,"family",local_18 & 0xffffffff,local_50,1);
    local_5c = 0xaaaaaaaa;
    local_68 = (_FcPattern *)FcFontMatch(0,uVar4,&local_5c);
    QList<_FcPattern_*>::insert
              ((QList<_FcPattern_*> *)in_stack_ffffffffffffff58,(qsizetype)in_stack_ffffffffffffff50
               ,t);
    FcPatternDestroy(uVar4);
    QByteArray::~QByteArray((QByteArray *)0xa7f8b2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_68;
}

Assistant:

FcPattern * QFontEngineMultiFontConfig::getMatchPatternForFallback(int fallBackIndex) const
{
    Q_ASSERT(fallBackIndex < fallbackFamilyCount());
    if (fallbackFamilyCount() > cachedMatchPatterns.size())
        cachedMatchPatterns.resize(fallbackFamilyCount());
    FcPattern *ret = cachedMatchPatterns.at(fallBackIndex);
    if (ret)
        return ret;
    FcPattern *requestPattern = FcPatternCreate();
    FcValue value;
    value.type = FcTypeString;
    QByteArray cs = fallbackFamilyAt(fallBackIndex).toUtf8();
    value.u.s = reinterpret_cast<const FcChar8 *>(cs.data());
    FcPatternAdd(requestPattern, FC_FAMILY, value, true);
    FcResult result;
    ret = FcFontMatch(nullptr, requestPattern, &result);
    cachedMatchPatterns.insert(fallBackIndex, ret);
    FcPatternDestroy(requestPattern);
    return ret;
}